

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

void fn_build_full_path(char *buf,size_t buflen,char *dir,char *fname,int literal)

{
  int iVar1;
  size_t sVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  char *pcVar3;
  char dirlast;
  char *unaff_retaddr;
  size_t dirlen;
  char cVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  
  iVar1 = CVmNetFile::is_net_mode();
  if (iVar1 == 0) {
    if (in_R8D == 0) {
      os_build_full_path(in_RCX,(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      os_combine_paths(in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  else {
    if (*in_RCX == '/') {
      lib_strcpy(in_RSI,(size_t)in_RDX,in_RCX);
    }
    else {
      sVar2 = strlen(in_RDX);
      if (sVar2 == 0) {
        cVar4 = '\0';
      }
      else {
        cVar4 = in_RDX[sVar2 - 1];
      }
      pcVar3 = "/";
      if (cVar4 == '/') {
        pcVar3 = "";
      }
      t3sprintf(in_RDI,(size_t)in_RSI,"%s%s%s",in_RDX,pcVar3,in_RCX);
    }
    if (in_R8D == 0) {
      nf_canonicalize(unaff_retaddr);
    }
  }
  return;
}

Assistant:

static void fn_build_full_path(
    VMG_ char *buf, size_t buflen,
    const char *dir, const char *fname, int literal)
{
    if (CVmNetFile::is_net_mode(vmg0_))
    {
        /* 
         *   Network storage mode - use Unix rules.  First, if the filename
         *   is in absolute format already, use it unchanged.  If not, append
         *   the filename to the directory, adding a '/' between the two if
         *   the directory doesn't already end with a slash.
         */
        if (fname[0] == '/')
        {
            /* the file is absolute - return it unchanged */
            lib_strcpy(buf, buflen, fname);
        }
        else
        {
            /* note the last character of the directory path */
            size_t dirlen = strlen(dir);
            char dirlast = dirlen != 0 ? dir[dirlen-1] : 0;

            /* build the result */
            t3sprintf(buf, buflen, "%s%s%s",
                      dir, dirlast == '/' ? "" : "/", fname);
        }

        /* if not in literal mode, canonicalize the result */
        if (!literal)
            nf_canonicalize(buf);
    }
    else
    {
        /* local storage mode - use local OS rules */
        if (literal)
            os_combine_paths(buf, buflen, dir, fname);
        else
            os_build_full_path(buf, buflen, dir, fname);
    }
}